

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O3

void DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  DiyFp DVar15;
  
  bVar2 = -(char)Mp->e;
  uVar13 = 1L << (bVar2 & 0x3f);
  DVar15 = DiyFp::operator-(Mp,W);
  uVar1 = DVar15.f;
  uVar12 = Mp->f >> (bVar2 & 0x3f);
  uVar9 = 1;
  uVar8 = (uint)uVar12;
  if (((((9 < uVar8) && (uVar9 = 2, 99 < uVar8)) && (uVar9 = 3, 999 < uVar8)) &&
      ((uVar9 = 4, 9999 < uVar8 && (uVar9 = 5, 99999 < uVar8)))) &&
     ((uVar9 = 6, 999999 < uVar8 && ((uVar9 = 7, 9999999 < uVar8 && (uVar9 = 8, 99999999 < uVar8))))
     )) {
    uVar9 = (ulong)(10 - (uVar8 < 1000000000));
  }
  uVar4 = Mp->f & uVar13 - 1;
  *len = 0;
  do {
    uVar8 = (uint)uVar12;
    if ((int)uVar9 < 1) {
      uVar8 = 0;
      do {
        uVar12 = delta;
        cVar10 = (char)(uVar4 * 10 >> (bVar2 & 0x3f));
        iVar5 = *len;
        if (cVar10 != '\0' || iVar5 != 0) {
          *len = iVar5 + 1;
          buffer[iVar5] = cVar10 + '0';
        }
        delta = uVar12 * 10;
        uVar4 = uVar4 * 10 & uVar13 - 1;
        uVar8 = uVar8 + 1;
      } while (delta < uVar4 || delta - uVar4 == 0);
      *K = *K - uVar8;
      if (uVar13 <= delta - uVar4) {
        uVar1 = uVar1 * DigitGen::kPow10[uVar8];
        uVar9 = uVar1 - uVar4;
        if (uVar1 < uVar4 || uVar9 == 0) {
          return;
        }
        iVar5 = *len;
        uVar4 = uVar4 + uVar13;
        uVar12 = uVar12 * 10 - uVar4;
        do {
          if ((uVar1 <= uVar4) && (uVar9 <= uVar4 - uVar1)) {
            return;
          }
          buffer[(long)iVar5 + -1] = buffer[(long)iVar5 + -1] + -1;
          bVar14 = uVar13 <= uVar12;
          uVar12 = uVar12 - uVar13;
          if (uVar1 <= uVar4) {
            return;
          }
          uVar9 = uVar9 - uVar13;
          uVar4 = uVar4 + uVar13;
        } while (bVar14);
        return;
      }
      return;
    }
    uVar7 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar7;
    switch(uVar9) {
    case 0:
      uVar12 = 0;
      goto LAB_0016c0ca;
    case 1:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 10);
      iVar5 = (int)((uVar12 & 0xffffffff) / 10) * 10;
      break;
    case 2:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 100);
      iVar5 = (int)((uVar12 & 0xffffffff) / 100) * 100;
      break;
    case 3:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 1000);
      iVar5 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
      break;
    case 4:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 10000);
      iVar5 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
      break;
    case 5:
      uVar11 = (uVar8 >> 5) / 0xc35;
      iVar5 = ((uVar8 >> 5) / 0xc35) * 100000;
      break;
    case 6:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 1000000);
      iVar5 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 7:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 10000000);
      iVar5 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 8:
      uVar11 = (uint)((uVar12 & 0xffffffff) / 100000000);
      iVar5 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
      break;
    case 9:
      uVar3 = (uint)((ulong)(uVar8 >> 9) * 0x44b83 >> 0x20);
      uVar11 = uVar3 >> 7;
      iVar5 = (uVar3 >> 7) * 1000000000;
      break;
    default:
      iVar5 = *len;
      uVar3 = uVar8;
      goto LAB_0016c0de;
    }
    uVar12 = (ulong)(uVar8 - iVar5);
    uVar8 = uVar11;
LAB_0016c0ca:
    uVar3 = (uint)uVar12;
    iVar5 = *len;
    if (uVar8 == 0) {
LAB_0016c0de:
      cVar10 = '0';
      if (iVar5 != 0) goto LAB_0016c0e5;
    }
    else {
      cVar10 = (char)uVar8 + '0';
LAB_0016c0e5:
      *len = iVar5 + 1;
      buffer[iVar5] = cVar10;
      uVar12 = (ulong)uVar3;
    }
    uVar6 = ((uVar12 & 0xffffffff) << (bVar2 & 0x3f)) + uVar4;
    if (uVar6 <= delta) {
      *K = *K + uVar7;
      uVar12 = (ulong)DigitGen::kPow10[uVar9] << (bVar2 & 0x3f);
      if ((uVar6 < uVar1) && (uVar12 <= delta - uVar6)) {
        iVar5 = *len;
        uVar9 = uVar1 - uVar6;
        uVar6 = uVar6 + uVar12;
        uVar13 = delta - uVar6;
        do {
          if ((uVar1 <= uVar6) && (uVar9 <= uVar6 - uVar1)) {
            return;
          }
          buffer[(long)iVar5 + -1] = buffer[(long)iVar5 + -1] + -1;
          bVar14 = uVar12 <= uVar13;
          uVar13 = uVar13 - uVar12;
          if (uVar1 <= uVar6) {
            return;
          }
          uVar9 = uVar9 - uVar12;
          uVar6 = uVar6 + uVar12;
        } while (bVar14);
      }
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
	static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
	const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
	const DiyFp wp_w = Mp - W;
	uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
	uint64_t p2 = Mp.f & (one.f - 1);
	int kappa = static_cast<int>(CountDecimalDigit32(p1));
	*len = 0;

	while (kappa > 0) {
		uint32_t d;
		switch (kappa) {
			case 10: d = p1 / 1000000000; p1 %= 1000000000; break;
			case  9: d = p1 /  100000000; p1 %=  100000000; break;
			case  8: d = p1 /   10000000; p1 %=   10000000; break;
			case  7: d = p1 /    1000000; p1 %=    1000000; break;
			case  6: d = p1 /     100000; p1 %=     100000; break;
			case  5: d = p1 /      10000; p1 %=      10000; break;
			case  4: d = p1 /       1000; p1 %=       1000; break;
			case  3: d = p1 /        100; p1 %=        100; break;
			case  2: d = p1 /         10; p1 %=         10; break;
			case  1: d = p1;              p1 =           0; break;
			default:
#if defined(_MSC_VER)
				__assume(0);
#elif defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 5))
				__builtin_unreachable();
#else
				d = 0;
#endif
		}
		if (d || *len)
			buffer[(*len)++] = '0' + static_cast<char>(d);
		kappa--;
		uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
		if (tmp <= delta) {
			*K += kappa;
			GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
			return;
		}
	}

	// kappa = 0
	for (;;) {
		p2 *= 10;
		delta *= 10;
		char d = static_cast<char>(p2 >> -one.e);
		if (d || *len)
			buffer[(*len)++] = '0' + d;
		p2 &= one.f - 1;
		kappa--;
		if (p2 < delta) {
			*K += kappa;
			GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * kPow10[-kappa]);
			return;
		}
	}
}